

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

routine_t cs_impl::fiber::create(context_t *cxt,function<void_()> *f)

{
  bool bVar1;
  value_type pRVar2;
  long lVar3;
  size_type sVar4;
  reference pvVar5;
  vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *pvVar6;
  reference ppRVar7;
  function<void_()> *in_RSI;
  routine_t id;
  Routine *routine;
  function<void_()> *in_stack_ffffffffffffff78;
  value_type __x;
  value_type this;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffffb4;
  context_t *in_stack_ffffffffffffffb8;
  Routine *in_stack_ffffffffffffffc0;
  routine_t local_4;
  
  pRVar2 = (value_type)operator_new(0x438);
  uVar8 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
  this = pRVar2;
  std::function<void_()>::function(in_RSI,in_stack_ffffffffffffff78);
  Routine::Routine(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (function<void_()> *)CONCAT44(in_stack_ffffffffffffffb4,uVar8));
  std::function<void_()>::~function((function<void_()> *)0x20f432);
  __x = pRVar2;
  lVar3 = ordinator();
  bVar1 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::empty
                    ((list<unsigned_int,_std::allocator<unsigned_int>_> *)(lVar3 + 0x18));
  if (bVar1) {
    ordinator();
    std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::push_back
              ((vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)this
               ,(value_type *)__x);
    pvVar6 = (vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
             ordinator();
    sVar4 = std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::size
                      (pvVar6);
    local_4 = (routine_t)sVar4;
  }
  else {
    ordinator();
    pvVar5 = std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::front
                       ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI);
    local_4 = *pvVar5;
    ordinator();
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::pop_front
              ((list<unsigned_int,_std::allocator<unsigned_int>_> *)in_RSI);
    pvVar6 = (vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
             ordinator();
    ppRVar7 = std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::
              operator[](pvVar6,(ulong)(local_4 - 1));
    if (*ppRVar7 != (value_type)0x0) {
      __assert_fail("ordinator.routines[id - 1] == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/sources/system/./unix/common.cpp"
                    ,0x137,
                    "routine_t cs_impl::fiber::create(const cs::context_t &, std::function<void ()>)"
                   );
    }
    pvVar6 = (vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_> *)
             ordinator();
    ppRVar7 = std::vector<cs_impl::fiber::Routine_*,_std::allocator<cs_impl::fiber::Routine_*>_>::
              operator[](pvVar6,(ulong)(local_4 - 1));
    *ppRVar7 = pRVar2;
  }
  return local_4;
}

Assistant:

routine_t create(const cs::context_t &cxt, std::function<void()> f)
		{
			Routine *routine = new Routine(cxt, std::move(f));

			if (ordinator.indexes.empty()) {
				ordinator.routines.push_back(routine);
				return ordinator.routines.size();
			}
			else {
				routine_t id = ordinator.indexes.front();
				ordinator.indexes.pop_front();
				assert(ordinator.routines[id - 1] == nullptr);
				ordinator.routines[id - 1] = routine;
				return id;
			}
		}